

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Convolution3DLayerParams::Convolution3DLayerParams
          (Convolution3DLayerParams *this)

{
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__Convolution3DLayerParams_0040c948;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->outputshape_).current_size_ = 0;
  (this->outputshape_).total_size_ = 0;
  (this->outputshape_).rep_ = (Rep *)0x0;
  if (this != (Convolution3DLayerParams *)&_Convolution3DLayerParams_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  this->custompaddingtop_ = 0;
  this->custompaddingbottom_ = 0;
  this->custompaddingleft_ = 0;
  this->custompaddingright_ = 0;
  this->hasbias_ = false;
  this->isdeconvolution_ = false;
  *(undefined2 *)&this->field_0x6a = 0;
  this->paddingtype_ = 0;
  this->custompaddingfront_ = 0;
  this->custompaddingback_ = 0;
  this->stridewidth_ = 0;
  this->dilationdepth_ = 0;
  this->dilationheight_ = 0;
  this->dilationwidth_ = 0;
  this->kernelheight_ = 0;
  this->kernelwidth_ = 0;
  this->stridedepth_ = 0;
  this->strideheight_ = 0;
  this->outputchannels_ = 0;
  this->inputchannels_ = 0;
  this->ngroups_ = 0;
  this->kerneldepth_ = 0;
  this->weights_ = (WeightParams *)0x0;
  this->bias_ = (WeightParams *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

Convolution3DLayerParams::Convolution3DLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.Convolution3DLayerParams)
}